

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayCreation.h
# Opt level: O0

Expression * CreateArray(Expression *array_size)

{
  ExpressionList *this;
  BinopExpression *this_00;
  ConstExpression *this_01;
  BinopExpression *this_02;
  ConstExpression *this_03;
  EseqExpression *this_04;
  SeqStatement *this_05;
  MoveStatement *this_06;
  TempExpression *pTVar1;
  CallExpression *this_07;
  NameExpression *this_08;
  MoveStatement *this_09;
  MemExpression *this_10;
  Temporary local_100;
  undefined1 local_dc;
  undefined1 local_db;
  undefined1 local_da;
  undefined1 local_d9;
  Temporary local_d8;
  undefined1 local_b4;
  undefined1 local_b3;
  undefined1 local_b2;
  allocator<char> local_b1;
  string local_b0;
  Label local_90;
  undefined1 local_69;
  Temporary local_68;
  undefined1 local_48 [8];
  Temporary tmp;
  ExpressionList *irt_expressions;
  Expression *array_size_local;
  
  this = (ExpressionList *)operator_new(0x20);
  (this->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_BaseElement)._vptr_BaseElement = (_func_int **)0x0;
  (this->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  IRT::ExpressionList::ExpressionList(this);
  this_00 = (BinopExpression *)operator_new(0x20);
  this_01 = (ConstExpression *)operator_new(0x10);
  IRT::ConstExpression::ConstExpression(this_01,4);
  this_02 = (BinopExpression *)operator_new(0x20);
  this_03 = (ConstExpression *)operator_new(0x10);
  IRT::ConstExpression::ConstExpression(this_03,1);
  IRT::BinopExpression::BinopExpression(this_02,PLUS,array_size,(Expression *)this_03);
  IRT::BinopExpression::BinopExpression(this_00,MUL,(Expression *)this_01,(Expression *)this_02);
  IRT::ExpressionList::Add(this,(Expression *)this_00);
  IRT::Temporary::Temporary((Temporary *)local_48);
  this_04 = (EseqExpression *)operator_new(0x18);
  this_05 = (SeqStatement *)operator_new(0x18);
  local_dc = 1;
  this_06 = (MoveStatement *)operator_new(0x18);
  local_b4 = 1;
  pTVar1 = (TempExpression *)operator_new(0x28);
  local_69 = 1;
  IRT::Temporary::Temporary(&local_68,(Temporary *)local_48);
  IRT::TempExpression::TempExpression(pTVar1,&local_68);
  local_69 = 0;
  this_07 = (CallExpression *)operator_new(0x18);
  local_b3 = 1;
  this_08 = (NameExpression *)operator_new(0x28);
  local_b2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"malloc",&local_b1);
  IRT::Label::Label(&local_90,&local_b0);
  IRT::NameExpression::NameExpression(this_08,&local_90);
  local_b2 = 0;
  IRT::CallExpression::CallExpression(this_07,(Expression *)this_08,this);
  local_b3 = 0;
  IRT::MoveStatement::MoveStatement(this_06,(Expression *)pTVar1,(Expression *)this_07);
  local_b4 = 0;
  this_09 = (MoveStatement *)operator_new(0x18);
  local_db = 1;
  this_10 = (MemExpression *)operator_new(0x10);
  local_da = 1;
  pTVar1 = (TempExpression *)operator_new(0x28);
  local_d9 = 1;
  IRT::Temporary::Temporary(&local_d8,(Temporary *)local_48);
  IRT::TempExpression::TempExpression(pTVar1,&local_d8);
  local_d9 = 0;
  IRT::MemExpression::MemExpression(this_10,(Expression *)pTVar1);
  local_da = 0;
  IRT::MoveStatement::MoveStatement(this_09,(Expression *)this_10,array_size);
  local_db = 0;
  IRT::SeqStatement::SeqStatement(this_05,(Statement *)this_06,(Statement *)this_09);
  local_dc = 0;
  pTVar1 = (TempExpression *)operator_new(0x28);
  IRT::Temporary::Temporary(&local_100,(Temporary *)local_48);
  IRT::TempExpression::TempExpression(pTVar1,&local_100);
  IRT::EseqExpression::EseqExpression(this_04,(Statement *)this_05,(Expression *)pTVar1);
  IRT::Temporary::~Temporary(&local_100);
  IRT::Temporary::~Temporary(&local_d8);
  IRT::Label::~Label(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  IRT::Temporary::~Temporary(&local_68);
  IRT::Temporary::~Temporary((Temporary *)local_48);
  return &this_04->super_Expression;
}

Assistant:

IRT::Expression* CreateArray(IRT::Expression* array_size) {
  auto* irt_expressions = new IRT::ExpressionList();
  irt_expressions->Add(new IRT::BinopExpression(
      IRT::BinaryOperatorType::MUL, new IRT::ConstExpression(COMPILER_WORD_SIZE),
      new IRT::BinopExpression(IRT::BinaryOperatorType::PLUS, array_size,
                               new IRT::ConstExpression(1))));

  IRT::Temporary tmp;
  return new IRT::EseqExpression(
      new IRT::SeqStatement(
          new IRT::MoveStatement(
              new IRT::TempExpression(tmp),
              new IRT::CallExpression(
                  new IRT::NameExpression(IRT::Label("malloc")),
                  irt_expressions)),
          new IRT::MoveStatement(
              new IRT::MemExpression(new IRT::TempExpression(tmp)),
              array_size)),
      new IRT::TempExpression(tmp));
}